

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ConstantValue::convertToShortReal(ConstantValue *__return_storage_ptr__,ConstantValue *this)

{
  bool bVar1;
  SVInt *this_00;
  float v;
  double dVar2;
  shortreal_t local_2c;
  real_t local_28;
  shortreal_t local_1c;
  ConstantValue *local_18;
  ConstantValue *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  bVar1 = isShortReal(this);
  if (bVar1) {
    ConstantValue(__return_storage_ptr__,this);
  }
  else {
    bVar1 = isReal(this);
    if (bVar1) {
      local_28 = real(this);
      dVar2 = real_t::operator_cast_to_double(&local_28);
      shortreal_t::shortreal_t(&local_1c,(float)dVar2);
      ConstantValue(__return_storage_ptr__,local_1c);
    }
    else {
      bVar1 = isInteger(this);
      if (bVar1) {
        this_00 = integer(this);
        v = SVInt::toFloat(this_00);
        shortreal_t::shortreal_t(&local_2c,v);
        ConstantValue(__return_storage_ptr__,local_2c);
      }
      else {
        ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue ConstantValue::convertToShortReal() const {
    if (isShortReal())
        return *this;

    if (isReal())
        return shortreal_t((float)real());

    if (isInteger())
        return shortreal_t(integer().toFloat());

    return nullptr;
}